

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

void on_connection_state_changed
               (void *context,CONNECTION_STATE new_connection_state,
               CONNECTION_STATE previous_connection_state)

{
  int iVar1;
  SESSION_STATE SStack_10;
  
  if (previous_connection_state == CONNECTION_STATE_OPENED ||
      new_connection_state != CONNECTION_STATE_OPENED) {
    if (new_connection_state != CONNECTION_STATE_CLOSE_RCVD) {
      if (new_connection_state == CONNECTION_STATE_ERROR) {
        SStack_10 = SESSION_STATE_ERROR;
        goto LAB_0015b9d5;
      }
      if (new_connection_state != CONNECTION_STATE_END) {
        return;
      }
    }
    SStack_10 = SESSION_STATE_DISCARDING;
  }
  else {
    if ((*(int *)((long)context + 0x10) != 1) ||
       (iVar1 = send_begin((SESSION_INSTANCE *)context), iVar1 != 0)) {
      return;
    }
    SStack_10 = SESSION_STATE_BEGIN_SENT;
  }
LAB_0015b9d5:
  session_set_state((SESSION_INSTANCE *)context,SStack_10);
  return;
}

Assistant:

static void on_connection_state_changed(void* context, CONNECTION_STATE new_connection_state, CONNECTION_STATE previous_connection_state)
{
    SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)context;

    /* Codes_S_R_S_SESSION_01_060: [If the previous connection state is not OPENED and the new connection state is OPENED, the BEGIN frame shall be sent out and the state shall be switched to BEGIN_SENT.] */
    if ((new_connection_state == CONNECTION_STATE_OPENED) && (previous_connection_state != CONNECTION_STATE_OPENED) && (session_instance->session_state == SESSION_STATE_UNMAPPED))
    {
        if (send_begin(session_instance) == 0)
        {
            session_set_state(session_instance, SESSION_STATE_BEGIN_SENT);
        }
    }
    /* Codes_S_R_S_SESSION_01_061: [If the previous connection state is OPENED and the new connection state is not OPENED anymore, the state shall be switched to DISCARDING.] */
    else if ((new_connection_state == CONNECTION_STATE_CLOSE_RCVD) || (new_connection_state == CONNECTION_STATE_END))
    {
        session_set_state(session_instance, SESSION_STATE_DISCARDING);
    }
    /* Codes_S_R_S_SESSION_09_001: [If the new connection state is ERROR, the state shall be switched to ERROR.] */
    else if (new_connection_state == CONNECTION_STATE_ERROR)
    {
        session_set_state(session_instance, SESSION_STATE_ERROR);
    }
}